

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BroadcastReceiver.h
# Opt level: O0

bool __thiscall
aeron::concurrent::broadcast::BroadcastReceiver::receiveNext(BroadcastReceiver *this)

{
  bool bVar1;
  int32_t iVar2;
  int iVar3;
  int64_t iVar4;
  undefined8 *in_RDI;
  index_t recordOffset;
  int64_t cursor;
  int64_t tail;
  bool isAvailable;
  undefined4 in_stack_ffffffffffffffa8;
  index_t in_stack_ffffffffffffffac;
  BroadcastReceiver *in_stack_ffffffffffffffb0;
  AtomicBuffer *this_00;
  uint local_24;
  long local_20;
  bool local_9;
  
  local_9 = false;
  iVar4 = AtomicBuffer::getInt64Volatile
                    ((AtomicBuffer *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  local_20 = in_RDI[5];
  if (local_20 < iVar4) {
    local_24 = (uint)local_20 & *(uint *)((long)in_RDI + 0xc);
    bVar1 = validate(in_stack_ffffffffffffffb0,
                     CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    if (!bVar1) {
      std::__atomic_base<long>::operator+=((__atomic_base<long> *)(in_RDI + 6),1);
      local_20 = AtomicBuffer::getInt64
                           ((AtomicBuffer *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
      local_24 = (uint)local_20 & *(uint *)((long)in_RDI + 0xc);
    }
    in_RDI[4] = local_20;
    RecordDescriptor::lengthOffset(local_24);
    iVar2 = AtomicBuffer::getInt32
                      ((AtomicBuffer *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    iVar3 = util::BitUtil::align<int>(iVar2,8);
    in_RDI[5] = local_20 + iVar3;
    RecordDescriptor::typeOffset(local_24);
    iVar2 = AtomicBuffer::getInt32
                      ((AtomicBuffer *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    if (iVar2 == -1) {
      local_24 = 0;
      in_RDI[4] = in_RDI[5];
      this_00 = (AtomicBuffer *)*in_RDI;
      RecordDescriptor::lengthOffset(0);
      iVar2 = AtomicBuffer::getInt32(this_00,in_stack_ffffffffffffffac);
      iVar3 = util::BitUtil::align<int>(iVar2,8);
      in_RDI[5] = (long)iVar3 + in_RDI[5];
    }
    *(uint *)((long)in_RDI + 0x1c) = local_24;
    local_9 = true;
  }
  return local_9;
}

Assistant:

bool receiveNext()
    {
        bool isAvailable = false;
        const std::int64_t tail = m_buffer.getInt64Volatile(m_tailCounterIndex);
        std::int64_t cursor = m_nextRecord;

        if (tail > cursor)
        {
            util::index_t recordOffset = (std::int32_t)cursor & m_mask;

            if (!validate(cursor))
            {
                m_lappedCount += 1;
                cursor = m_buffer.getInt64(m_latestCounterIndex);
                recordOffset = (std::int32_t)cursor & m_mask;
            }

            m_cursor = cursor;
            m_nextRecord = cursor + util::BitUtil::align(
                m_buffer.getInt32(RecordDescriptor::lengthOffset(recordOffset)), RecordDescriptor::RECORD_ALIGNMENT);

            if (RecordDescriptor::PADDING_MSG_TYPE_ID == m_buffer.getInt32(RecordDescriptor::typeOffset(recordOffset)))
            {
                recordOffset = 0;
                m_cursor = m_nextRecord;
                m_nextRecord += util::BitUtil::align(m_buffer.getInt32(
                    RecordDescriptor::lengthOffset(recordOffset)), RecordDescriptor::RECORD_ALIGNMENT);
            }

            m_recordOffset = recordOffset;
            isAvailable = true;
        }

        return isAvailable;
    }